

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std.cpp
# Opt level: O0

int lib_atoi(char *str,size_t len)

{
  int iVar1;
  long in_RSI;
  char *in_RDI;
  bool bVar2;
  int acc;
  int s;
  int local_18;
  int local_14;
  long local_10;
  char *local_8;
  
  local_14 = 1;
  if ((in_RSI == 0) || (*in_RDI != '-')) {
    local_10 = in_RSI;
    local_8 = in_RDI;
    if ((in_RSI != 0) && (*in_RDI == '+')) {
      local_8 = in_RDI + 1;
      local_10 = in_RSI + -1;
    }
  }
  else {
    local_14 = -1;
    local_8 = in_RDI + 1;
    local_10 = in_RSI + -1;
  }
  local_18 = 0;
  while( true ) {
    bVar2 = false;
    if (local_10 != 0) {
      iVar1 = is_digit(L'\0');
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    iVar1 = value_of_digit((int)*local_8);
    local_18 = iVar1 + local_18 * 10;
    local_8 = local_8 + 1;
    local_10 = local_10 + -1;
  }
  return local_14 * local_18;
}

Assistant:

int lib_atoi(const char *str, size_t len)
{
    /* parse the sign, if present */
    int s = 1;
    if (len >= 1 && *str == '-')
        s = -1, ++str, --len;
    else if (len >= 1 && *str == '+')
        ++str, --len;

    /* scan digits */
    int acc;
    for (acc = 0 ; len > 0 && is_digit(*str) ;
         acc *= 10, acc += value_of_digit(*str), ++str, --len) ;

    /* apply the sign and return the result */
    return s * acc;
}